

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Entry *pEVar4;
  Unit *key;
  InferenceExtra *pIVar5;
  Entry *res;
  Entry *pEVar6;
  Exception *this_00;
  Entry *pEVar7;
  pointer *__ptr;
  pointer *__ptr_2;
  unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *puVar8;
  ulong uVar9;
  long lVar10;
  _Head_base<0UL,_Lib::InferenceExtra_*,_false> local_48;
  Entry *local_40;
  long local_38;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar10 = (long)iVar1;
  uVar9 = lVar10 * 0x18 + 0xfU & 0xfffffffffffffff0;
  if (uVar9 == 0) {
    pEVar6 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pEVar6 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
  }
  else if (uVar9 < 0x19) {
    pEVar6 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
  }
  else if (uVar9 < 0x21) {
    pEVar6 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
  }
  else if (uVar9 < 0x31) {
    pEVar6 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
  }
  else if (uVar9 < 0x41) {
    pEVar6 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
  }
  else {
    pEVar6 = (Entry *)::operator_new(uVar9,0x10);
  }
  local_40 = this->_entries;
  pEVar4 = this->_afterLast;
  uVar2 = this->_timestamp;
  local_38 = (long)this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar3 = this->_capacityIndex;
  this->_capacityIndex = iVar3 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar3 * 4 + 4);
  pEVar7 = pEVar6;
  if (iVar1 != 0) {
    do {
      (pEVar7->field_0)._infoData = 0;
      (pEVar7->_val)._M_t.
      super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
      super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
      super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)0x0;
      lVar10 = lVar10 + -1;
      pEVar7 = pEVar7 + 1;
    } while (lVar10 != 0);
  }
  this->_entries = pEVar6;
  this->_afterLast = pEVar6 + this->_capacity;
  if (local_40 != pEVar4) {
    puVar8 = &local_40->_val;
    do {
      if (((((Entry *)(puVar8 + -2))->field_0)._infoData & 1U) == 0 &&
          (uint)(((Entry *)(puVar8 + -2))->field_0)._infoData >> 2 == uVar2) {
        key = *(Unit **)(puVar8 + -1);
        local_48._M_head_impl =
             (puVar8->_M_t).
             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
             _M_t.
             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
        (puVar8->_M_t).
        super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
        super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
        super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)0x0;
        insert(this,key,(unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
                         *)&local_48);
        if (local_48._M_head_impl != (InferenceExtra *)0x0) {
          (*(local_48._M_head_impl)->_vptr_InferenceExtra[1])();
        }
        local_48._M_head_impl = (InferenceExtra *)0x0;
      }
      pIVar5 = (puVar8->_M_t).
               super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
               .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
      if (pIVar5 != (InferenceExtra *)0x0) {
        (*pIVar5->_vptr_InferenceExtra[1])();
      }
      (puVar8->_M_t).
      super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
      super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
      super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)0x0;
      pEVar6 = (Entry *)(puVar8 + 1);
      puVar8 = puVar8 + 3;
    } while (pEVar6 != pEVar4);
  }
  if (((int)local_38 != 0) && (local_40 != (Entry *)0x0)) {
    uVar9 = local_38 * 0x18 + 0xfU & 0xfffffffffffffff0;
    if (uVar9 == 0) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_40;
    }
    else if (uVar9 < 0x11) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_40;
    }
    else if (uVar9 < 0x19) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_40;
    }
    else if (uVar9 < 0x21) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_40;
    }
    else if (uVar9 < 0x31) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_40;
    }
    else if (uVar9 < 0x41) {
      *(undefined8 *)local_40 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_40;
    }
    else {
      operator_delete(local_40,0x10);
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }